

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::verify
          (MemoryTestInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  size_type *psVar1;
  ostringstream *this_00;
  TestLog *log;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  pointer ppCVar5;
  undefined7 extraout_var;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  ScopedLogSection section;
  VerifyContext verifyContext;
  ulong *local_348;
  long local_340;
  ulong local_338;
  long lStack_330;
  string local_328;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8 [2];
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  ScopedLogSection local_288;
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  undefined1 local_240 [40];
  long local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  TextureLevel local_1f8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0xafb5fe);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_2f8 = *plVar6;
    lStack_2f0 = plVar3[3];
    local_308 = &local_2f8;
  }
  else {
    local_2f8 = *plVar6;
    local_308 = (long *)*plVar3;
  }
  local_300 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_308);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_338 = *puVar7;
    lStack_330 = plVar3[3];
    local_348 = &local_338;
  }
  else {
    local_338 = *puVar7;
    local_348 = (ulong *)*plVar3;
  }
  local_340 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  uVar8 = 0xf;
  if (local_348 != &local_338) {
    uVar8 = local_338;
  }
  if (uVar8 < (ulong)(local_2e0 + local_340)) {
    uVar8 = 0xf;
    if (local_2e8 != local_2d8) {
      uVar8 = local_2d8[0];
    }
    if (uVar8 < (ulong)(local_2e0 + local_340)) goto LAB_0065f3b1;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_348);
  }
  else {
LAB_0065f3b1:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_2e8);
  }
  local_240._0_8_ = local_240 + 0x10;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    local_240._16_8_ = *psVar1;
    local_240._24_8_ = puVar4[3];
  }
  else {
    local_240._16_8_ = *psVar1;
    local_240._0_8_ = (size_type *)*puVar4;
  }
  local_240._8_8_ = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1d0,0,(char *)0x0,0xafebc7);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_250 = *plVar6;
    lStack_248 = plVar3[3];
    local_260 = &local_250;
  }
  else {
    local_250 = *plVar6;
    local_260 = (long *)*plVar3;
  }
  local_258 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_260);
  puVar7 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar7) {
    local_2b8 = *puVar7;
    lStack_2b0 = plVar3[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *puVar7;
    local_2c8 = (ulong *)*plVar3;
  }
  local_2c0 = plVar3[1];
  *plVar3 = (long)puVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x70));
  uVar8 = 0xf;
  if (local_2c8 != &local_2b8) {
    uVar8 = local_2b8;
  }
  if (uVar8 < (ulong)(local_278 + local_2c0)) {
    uVar8 = 0xf;
    if (local_280 != local_270) {
      uVar8 = local_270[0];
    }
    if ((ulong)(local_278 + local_2c0) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_2c8);
      goto LAB_0065f617;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_280);
LAB_0065f617:
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_328.field_2._M_allocated_capacity = *psVar1;
    local_328.field_2._8_8_ = puVar4[3];
  }
  else {
    local_328.field_2._M_allocated_capacity = *psVar1;
    local_328._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_328._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_288,log,(string *)local_240,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,local_250 + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  local_240._8_8_ = &this->m_resultCollector;
  local_240._16_8_ =
       (this->m_renderContext).
       super_UniqueBase<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
       .m_data.ptr;
  uVar8 = (this->m_config).size;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  local_240._0_8_ = log;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_240 + 0x18),uVar8,
             local_1b0,(allocator_type *)&local_348);
  local_1b0._0_8_ = (TestLog *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_210,((uVar8 >> 6) + 1) - (ulong)((uVar8 & 0x3f) == 0),
             (value_type_conflict3 *)local_1b0,(allocator_type *)&local_348);
  tcu::TextureLevel::TextureLevel(&local_1f8);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Begin verify",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  local_2c8 = (ulong *)0x0;
  ppCVar5 = (this->m_commands).
            super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_commands).
      super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppCVar5) {
    do {
      (*ppCVar5[(long)local_2c8]->_vptr_Command[7])(ppCVar5[(long)local_2c8],local_240);
      local_2c8 = (ulong *)((long)local_2c8 + 1);
      ppCVar5 = (this->m_commands).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (local_2c8 <
             (ulong *)((long)(this->m_commands).
                             super__Vector_base<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3));
  }
  bVar2 = nextIteration(this);
  tcu::TextureLevel::~TextureLevel(&local_1f8);
  if (local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((void *)local_240._24_8_ != (void *)0x0) {
    operator_delete((void *)local_240._24_8_,local_218 - local_240._24_8_);
  }
  tcu::TestLog::endSection(local_288.m_log);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool MemoryTestInstance::verify (void)
{
	DE_ASSERT(!m_commands.empty());

	TestLog&					log				= m_context.getTestContext().getLog();
	const tcu::ScopedLogSection	section			(log, "MemoryType" + de::toString(m_memoryTypeNdx) + "Verify" + de::toString(m_iteration),
													  "Memory type " + de::toString(m_memoryTypeNdx) + " verify iteration " + de::toString(m_iteration));
	VerifyContext				verifyContext	(log, m_resultCollector, *m_renderContext, m_config.size);

	log << TestLog::Message << "Begin verify" << TestLog::EndMessage;

	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
	{
		Command& command = *m_commands[cmdNdx];

		try
		{
			command.verify(verifyContext, cmdNdx);
		}
		catch (const tcu::TestError& e)
		{
			m_resultCollector.fail(de::toString(cmdNdx) + ":" + command.getName() + " failed to verify, got exception: " + string(e.getMessage()));
			return nextIteration();
		}
	}

	return nextIteration();
}